

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1eca73::ValueSetter::~ValueSetter(ValueSetter *this)

{
  ValueSetter *this_local;
  
  ~ValueSetter(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

~ValueSetter() override = default;